

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neurons.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  NeuronLayer nl;
  Neuron n1;
  Neuron n2;
  
  n1.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n1.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n1.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n1.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  n1.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  n1.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n2.id = Neuron::Neuron()::ID + 1;
  n1.id = Neuron::Neuron()::ID;
  n2.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n2.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n2.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n2.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  n2.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  n2.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Neuron::Neuron()::ID = Neuron::Neuron()::ID + 2;
  Neuron::connect_to<Neuron>(&n1,&n2);
  Neuron::connect_to<Neuron>(&n2,&n1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)&std::cout,&n1);
  poVar1 = operator<<(poVar1,&n2);
  std::endl<char,std::char_traits<char>>(poVar1);
  NeuronLayer::NeuronLayer(&nl,0xe);
  NeuronLayer::connect_to<Neuron>(&nl,&n1);
  poVar1 = operator<<((ostream *)&std::cout,&nl);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::vector<Neuron,_std::allocator<Neuron>_>::~vector
            (&nl.super_vector<Neuron,_std::allocator<Neuron>_>);
  Neuron::~Neuron(&n2);
  Neuron::~Neuron(&n1);
  return 0;
}

Assistant:

int main()
{
	Neuron n1, n2;
	n1.connect_to(n2);
	n2.connect_to(n1);
	std::cout << n1.in.size() << " " << n1.out.size() << std::endl;
	std::cout << n2.in.size() << " " << n2.out.size() << std::endl;
	std::cout << n1 << n2 << std::endl;

	NeuronLayer nl{14};
	nl.connect_to(n1);
	std::cout << nl << std::endl;

	return 0;
}